

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall pbrt::FormattingScene::AttributeBegin(FormattingScene *this,FileLoc loc)

{
  undefined1 *puVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct
            ((ulong)&local_38,(char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc);
  Printf<std::__cxx11::string>("\n%sAttributeBegin\n",&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  puVar1 = &(this->super_SceneRepresentation).field_0xc;
  *(int *)puVar1 = *(int *)puVar1 + 4;
  return;
}

Assistant:

void FormattingScene::AttributeBegin(FileLoc loc) {
    Printf("\n%sAttributeBegin\n", indent());
    catIndentCount += 4;
}